

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O1

void discrete_dist_test_pdf<trng::zero_truncated_poisson_dist>(zero_truncated_poisson_dist *d)

{
  uint x;
  double dVar1;
  double diff;
  AssertionHandler catchAssertionHandler;
  double local_e0;
  double local_d8 [2];
  SourceLineInfo local_c8;
  ITransientExpression local_b8;
  double *local_a8;
  char *local_a0;
  size_t sStack_98;
  double *local_90;
  StringRef local_88;
  AssertionHandler local_78;
  
  x = 1;
  local_e0 = trng::zero_truncated_poisson_dist::cdf(d,1);
  if (local_e0 < 0.95) {
    do {
      if (1 < x) {
        dVar1 = trng::zero_truncated_poisson_dist::cdf(d,x - 1);
        local_e0 = local_e0 - dVar1;
      }
      local_d8[0] = trng::zero_truncated_poisson_dist::pdf(d,x);
      local_d8[0] = local_e0 - local_d8[0];
      local_b8._vptr_ITransientExpression = (_func_int **)0x2a8487;
      local_b8.m_isBinaryExpression = true;
      local_b8.m_result = false;
      local_b8._10_6_ = 0;
      local_c8.file =
           "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
      ;
      local_c8.line = 0xeb;
      Catch::StringRef::StringRef(&local_88,"diff < 128 * std::numeric_limits<double>::epsilon()");
      Catch::AssertionHandler::AssertionHandler
                (&local_78,(StringRef *)&local_b8,&local_c8,local_88,Normal);
      dVar1 = local_d8[0];
      local_d8[1] = 2.842170943040401e-14;
      Catch::StringRef::StringRef((StringRef *)&local_c8,"<");
      local_b8.m_result = dVar1 < 2.842170943040401e-14;
      local_b8.m_isBinaryExpression = true;
      local_b8._vptr_ITransientExpression =
           (_func_int **)&PTR_streamReconstructedExpression_0031a2f8;
      local_a8 = local_d8;
      local_a0 = local_c8.file;
      sStack_98 = local_c8.line;
      local_90 = local_d8 + 1;
      Catch::AssertionHandler::handleExpr(&local_78,&local_b8);
      Catch::ITransientExpression::~ITransientExpression(&local_b8);
      Catch::AssertionHandler::complete(&local_78);
      if (local_78.m_completed == false) {
        (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])(local_78.m_resultCapture,&local_78)
        ;
      }
      x = x + 1;
      local_e0 = trng::zero_truncated_poisson_dist::cdf(d,x);
    } while (local_e0 < 0.95);
  }
  return;
}

Assistant:

void discrete_dist_test_pdf(dist &d) {
  int i{d.min()};
  double P{d.cdf(i)};
  while (P < 0.95) {
    double p{P};
    if (i > d.min())
      p -= d.cdf(i - 1);
    const double diff{p - d.pdf(i)};
    REQUIRE(diff < 128 * std::numeric_limits<double>::epsilon());
    ++i;
    P = d.cdf(i);
  }
}